

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLinearSCC
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  bool bVar1;
  pointer pvVar2;
  ulong uVar3;
  pointer piVar4;
  uint lhs;
  ulong uVar5;
  pointer pPVar6;
  pointer piVar7;
  ulong uVar8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  piVar4 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar7 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar7 != piVar4) {
    pvVar2 = (g->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      pPVar6 = pvVar2[uVar5].
               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lhs = (uint)uVar5;
      if (*(pointer *)
           ((long)&pvVar2[uVar5].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) != pPVar6) {
        uVar3 = 0;
        uVar8 = 1;
        do {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    (&local_48,
                     (g->rules).
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar6[uVar3].rule);
          bVar1 = isLLRule(this,g,lhs,&local_48,group_set);
          if (!bVar1) {
            if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            return false;
          }
          bVar1 = isRLRule(this,g,lhs,&local_48,group_set);
          if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar1) {
            return false;
          }
          pvVar2 = (g->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = pvVar2[uVar5].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = uVar8 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar5].
                                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pPVar6 >> 2);
          uVar3 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar1);
        piVar4 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar5 = (ulong)(lhs + 1);
    } while (uVar5 < (ulong)((long)piVar7 - (long)piVar4 >> 2));
  }
  return true;
}

Assistant:

bool isLinearSCC (const CFG &g, 
                    const vector<int> &group, 
                    const set<int>    &group_set)
  {
    for ( unsigned int vv = 0; vv < group.size(); vv++ )
    {
      for ( unsigned int ri = 0; ri < g.prods[vv].size(); ri++ )
      {
        int r = g.prods[vv][ri].rule;
        vector<EdgeSym> RHS = g.rules[r];
        if (!isLLRule(g, vv, RHS, group_set)) return false;
        if (!isRLRule(g, vv, RHS, group_set)) return false;
      }
    }
    // here all rules are either left-linear or right-linear.
    return true;
  }